

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

void do_cmd_disarm(command *cmd)

{
  player *p;
  _Bool _Var1;
  int16_t iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t uVar8;
  loc lVar9;
  object *obj;
  monster_conflict *mon;
  int iVar10;
  wchar_t dir;
  loc grid1;
  
  wVar3 = cmd_get_arg_direction((command_conflict *)cmd,"direction",&dir);
  if (dir == L'\0' || wVar3 != L'\0') {
    wVar3 = count_feats(&grid1,square_isdisarmabletrap,false);
    wVar4 = count_chests(&grid1,CHEST_TRAPPED);
    wVar5 = count_feats(&grid1,square_isunlockeddoor,false);
    if (wVar3 + wVar4 + wVar5 == 1) {
      lVar9.x = (player->grid).x;
      lVar9.y = (player->grid).y;
      dir = motion_dir(lVar9,grid1);
      cmd_set_arg_direction((command_conflict *)cmd,"direction",dir);
    }
    else {
      wVar3 = cmd_get_direction((command_conflict *)cmd,"direction",&dir,L'\0' < wVar4);
      if (wVar3 != L'\0') {
        return;
      }
    }
  }
  lVar9 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir]);
  obj = chest_check(player,lVar9,CHEST_TRAPPED);
  if ((obj != (object *)0x0) || (_Var1 = do_cmd_disarm_test(player,lVar9), _Var1)) {
    p = player;
    player->upkeep->energy_use = (uint)z_info->move_energy;
    _Var1 = player_confuse_dir(p,&dir,false);
    if (_Var1) {
      lVar9 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir]);
      obj = chest_check(player,lVar9,CHEST_TRAPPED);
    }
    mon = (monster_conflict *)square_monster(cave,lVar9);
    if (mon == (monster_conflict *)0x0) {
      if (obj == (object *)0x0) {
        _Var1 = square_iscloseddoor(cave,lVar9);
        if ((_Var1) && (_Var1 = square_islockeddoor(cave,lVar9), !_Var1)) {
          _Var1 = do_cmd_disarm_test(player,lVar9);
          if (_Var1) {
            uVar6 = (player->state).skills[0];
            if ((player->timed[2] != 0) || (_Var1 = no_light(player), _Var1)) {
              uVar6 = (int)uVar6 / 10;
            }
            if ((player->timed[4] != 0) || (player->timed[6] != 0)) {
              uVar6 = (int)uVar6 / 10;
            }
            iVar2 = m_bonus(7,(int)player->depth);
            iVar7 = uVar6 - (int)iVar2;
            iVar10 = 2;
            if (2 < iVar7) {
              iVar10 = iVar7;
            }
            uVar8 = Rand_div(100);
            if ((int)uVar8 < iVar10) {
              msg("You lock the door.");
              square_set_door_lock((chunk *)cave,lVar9,(int)iVar2);
            }
            else {
              if ((5 < (int)uVar6) && (uVar6 = Rand_div(uVar6), 4 < (int)uVar6)) {
                event_signal(EVENT_INPUT_FLUSH);
                msg("You failed to lock the door.");
                return;
              }
              msg("You failed to lock the door.");
            }
          }
          goto LAB_0012d467;
        }
        _Var1 = do_cmd_disarm_aux(lVar9);
      }
      else {
        _Var1 = do_cmd_disarm_chest(obj);
      }
      if (_Var1 != false) {
        return;
      }
    }
    else {
      _Var1 = monster_is_camouflaged((monster *)mon);
      if (_Var1) {
        become_aware((chunk *)cave,mon);
        monster_wake(mon,false,L'd');
      }
      else {
        msg("There is a monster in the way!");
        py_attack(player,lVar9);
      }
    }
  }
LAB_0012d467:
  disturb(player);
  return;
}

Assistant:

void do_cmd_disarm(struct command *cmd)
{
	struct loc grid;
	int dir;
	int err;

	struct object *obj;
	bool more = false;
	struct monster *mon;

	/* Get arguments */
	err = cmd_get_arg_direction(cmd, "direction", &dir);
	if (err || dir == DIR_UNKNOWN) {
		struct loc grid1;
		int n_traps, n_chests, n_unldoor;

		n_traps = count_feats(&grid1, square_isdisarmabletrap, false);
		n_chests = count_chests(&grid1, CHEST_TRAPPED);
		n_unldoor = count_feats(&grid1, square_isunlockeddoor, false);

		if (n_traps + n_chests + n_unldoor == 1) {
			dir = motion_dir(player->grid, grid1);
			cmd_set_arg_direction(cmd, "direction", dir);
		} else if (cmd_get_direction(cmd, "direction", &dir, n_chests > 0)) {
			/* If there are chests to disarm, 5 is allowed as a direction */
			return;
		}
	}

	/* Get location */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Check for chests */
	obj = chest_check(player, grid, CHEST_TRAPPED);

	/* Verify legality */
	if (!obj && !do_cmd_disarm_test(player, grid)) {
		/* Cancel repeat */
		disturb(player);
		return;
	}

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);

		/* Check for chests */
		obj = chest_check(player, grid, CHEST_TRAPPED);
	}


	/* Monster */
	mon = square_monster(cave, grid);
	if (mon) {
		if (monster_is_camouflaged(mon)) {
			become_aware(cave, mon);

			monster_wake(mon, false, 100);
		} else {
			msg("There is a monster in the way!");
			py_attack(player, grid);
		}
	} else if (obj)
		/* Chest */
		more = do_cmd_disarm_chest(obj);
	else if (square_iscloseddoor(cave, grid) &&
			 !square_islockeddoor(cave, grid))
		/* Door to lock */
		more = do_cmd_lock_door(grid);
	else
		/* Disarm trap */
		more = do_cmd_disarm_aux(grid);

	/* Cancel repeat unless told not to */
	if (!more) disturb(player);
}